

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Importer::ImportAnimations(glTF2Importer *this,Asset *r)

{
  aiScene *paVar1;
  pointer ppAVar2;
  Animation *anim;
  uint uVar3;
  aiAnimation **ppaVar4;
  aiAnimation *this_00;
  aiNodeAnim **ppaVar5;
  aiNodeAnim *paVar6;
  aiMeshMorphAnim **ppaVar7;
  aiMeshMorphAnim *paVar8;
  uint j;
  __node_base _Var9;
  ulong uVar10;
  uint uVar11;
  Asset *pAVar12;
  iterator __begin3;
  __node_base _Var13;
  int iVar14;
  __node_base *p_Var15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  samplers;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if ((r->scene).vector != (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0) {
    this->mScene->mNumAnimations =
         (uint)((ulong)((long)(r->animations).mObjs.
                              super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(r->animations).mObjs.
                             super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    paVar1 = this->mScene;
    uVar16 = (ulong)paVar1->mNumAnimations;
    if (uVar16 != 0) {
      ppaVar4 = (aiAnimation **)operator_new__(uVar16 << 3);
      paVar1->mAnimations = ppaVar4;
      uVar16 = 0;
      while( true ) {
        ppAVar2 = (r->animations).mObjs.
                  super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)(r->animations).mObjs.
                           super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2) >> 3 &
            0xffffffff) <= uVar16) break;
        anim = ppAVar2[uVar16];
        this_00 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_00);
        uVar10 = (anim->super_Object).name._M_string_length;
        if (uVar10 < 0x400) {
          (this_00->mName).length = (ai_uint32)uVar10;
          memcpy((this_00->mName).data,(anim->super_Object).name._M_dataplus._M_p,uVar10);
          (this_00->mName).data[uVar10] = '\0';
        }
        this_00->mDuration = 0.0;
        this_00->mTicksPerSecond = 0.0;
        GatherSamplers((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                        *)&local_68,anim);
        _Var13._M_nxt = local_68._M_before_begin._M_nxt;
        uVar11 = 0;
        uVar3 = 0;
        for (_Var9._M_nxt = local_68._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
            _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
          uVar3 = uVar3 + ((_Var9._M_nxt[4]._M_nxt != (_Hash_node_base *)0x0 ||
                           _Var9._M_nxt[3]._M_nxt != (_Hash_node_base *)0x0) ||
                          _Var9._M_nxt[2]._M_nxt != (_Hash_node_base *)0x0);
          uVar11 = (uVar11 + 1) - (uint)(_Var9._M_nxt[5]._M_nxt == (_Hash_node_base *)0x0);
        }
        this_00->mNumChannels = uVar3;
        if (uVar3 != 0) {
          pAVar12 = (Asset *)((ulong)uVar3 << 3);
          ppaVar5 = (aiNodeAnim **)operator_new__((ulong)pAVar12);
          this_00->mChannels = ppaVar5;
          iVar14 = 0;
          for (; _Var13._M_nxt != (_Hash_node_base *)0x0; _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt) {
            if (((_Var13._M_nxt[3]._M_nxt != (_Hash_node_base *)0x0) ||
                (_Var13._M_nxt[4]._M_nxt != (_Hash_node_base *)0x0)) ||
               (_Var13._M_nxt[2]._M_nxt != (_Hash_node_base *)0x0)) {
              paVar6 = CreateNodeAnim(pAVar12,(r->nodes).mObjs.
                                              super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [*(uint *)&_Var13._M_nxt[1]._M_nxt],
                                      (AnimationSamplers *)(_Var13._M_nxt + 2));
              this_00->mChannels[iVar14] = paVar6;
              iVar14 = iVar14 + 1;
            }
          }
        }
        this_00->mNumMorphMeshChannels = uVar11;
        if (uVar11 != 0) {
          pAVar12 = (Asset *)((ulong)uVar11 << 3);
          ppaVar7 = (aiMeshMorphAnim **)operator_new__((ulong)pAVar12);
          this_00->mMorphMeshChannels = ppaVar7;
          uVar10 = 0;
          p_Var15 = &local_68._M_before_begin;
          while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
            if (p_Var15[5]._M_nxt != (_Hash_node_base *)0x0) {
              paVar8 = CreateMeshMorphAnim(pAVar12,(r->nodes).mObjs.
                                                                                                      
                                                  super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(uint)*(size_type *)(p_Var15 + 1)],
                                           (AnimationSamplers *)(p_Var15 + 2));
              this_00->mMorphMeshChannels[uVar10] = paVar8;
              uVar10 = (ulong)((int)uVar10 + 1);
            }
          }
        }
        dVar17 = 0.0;
        for (uVar10 = 0; this_00->mNumChannels != uVar10; uVar10 = uVar10 + 1) {
          paVar6 = this_00->mChannels[uVar10];
          dVar19 = dVar17;
          if ((paVar6->mNumPositionKeys != 0) &&
             (dVar19 = paVar6->mPositionKeys[paVar6->mNumPositionKeys - 1].mTime, dVar19 <= dVar17))
          {
            dVar19 = dVar17;
          }
          dVar18 = dVar19;
          if ((paVar6->mNumRotationKeys != 0) &&
             (dVar18 = paVar6->mRotationKeys[paVar6->mNumRotationKeys - 1].mTime, dVar18 <= dVar19))
          {
            dVar18 = dVar19;
          }
          dVar17 = dVar18;
          if ((paVar6->mNumScalingKeys != 0) &&
             (dVar17 = paVar6->mScalingKeys[paVar6->mNumScalingKeys - 1].mTime, dVar17 <= dVar18)) {
            dVar17 = dVar18;
          }
        }
        for (uVar10 = 0; this_00->mNumMorphMeshChannels != uVar10; uVar10 = uVar10 + 1) {
          uVar3 = this_00->mMorphMeshChannels[uVar10]->mNumKeys;
          dVar19 = dVar17;
          if ((uVar3 != 0) &&
             (dVar19 = this_00->mMorphMeshChannels[uVar10]->mKeys[uVar3 - 1].mTime, dVar19 <= dVar17
             )) {
            dVar19 = dVar17;
          }
          dVar17 = dVar19;
        }
        this_00->mDuration = dVar17;
        this_00->mTicksPerSecond = 1000.0;
        this->mScene->mAnimations[uVar16] = this_00;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_68);
        uVar16 = uVar16 + 1;
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportAnimations(glTF2::Asset& r)
{
    if (!r.scene) return;

    mScene->mNumAnimations = r.animations.Size();
    if (mScene->mNumAnimations == 0) {
        return;
    }

    mScene->mAnimations = new aiAnimation*[mScene->mNumAnimations];
    for (unsigned int i = 0; i < r.animations.Size(); ++i) {
        Animation& anim = r.animations[i];

        aiAnimation* ai_anim = new aiAnimation();
        ai_anim->mName = anim.name;
        ai_anim->mDuration = 0;
        ai_anim->mTicksPerSecond = 0;

        std::unordered_map<unsigned int, AnimationSamplers> samplers = GatherSamplers(anim);

        uint32_t numChannels = 0u;
        uint32_t numMorphMeshChannels = 0u;

        for (auto& iter : samplers) {
            if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
                ++numChannels;
            }
            if (nullptr != iter.second.weight) {
                ++numMorphMeshChannels;
            }
        }

        ai_anim->mNumChannels = numChannels;
        if (ai_anim->mNumChannels > 0) {
            ai_anim->mChannels = new aiNodeAnim*[ai_anim->mNumChannels];
            int j = 0;
            for (auto& iter : samplers) {
                if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
                    ai_anim->mChannels[j] = CreateNodeAnim(r, r.nodes[iter.first], iter.second);
                    ++j;
                }
            }
        }

        ai_anim->mNumMorphMeshChannels = numMorphMeshChannels;
        if (ai_anim->mNumMorphMeshChannels > 0) {
            ai_anim->mMorphMeshChannels = new aiMeshMorphAnim*[ai_anim->mNumMorphMeshChannels];
            int j = 0;
            for (auto& iter : samplers) {
                if (nullptr != iter.second.weight) {
                  ai_anim->mMorphMeshChannels[j] = CreateMeshMorphAnim(r, r.nodes[iter.first], iter.second);
                  ++j;
                }
            }
        }

        // Use the latest keyframe for the duration of the animation
        double maxDuration = 0;
        unsigned int maxNumberOfKeys = 0;
        for (unsigned int j = 0; j < ai_anim->mNumChannels; ++j) {
            auto chan = ai_anim->mChannels[j];
            if (chan->mNumPositionKeys) {
                auto lastPosKey = chan->mPositionKeys[chan->mNumPositionKeys - 1];
                if (lastPosKey.mTime > maxDuration) {
                    maxDuration = lastPosKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumPositionKeys);
            }
            if (chan->mNumRotationKeys) {
                auto lastRotKey = chan->mRotationKeys[chan->mNumRotationKeys - 1];
                if (lastRotKey.mTime > maxDuration) {
                    maxDuration = lastRotKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumRotationKeys);
            }
            if (chan->mNumScalingKeys) {
                auto lastScaleKey = chan->mScalingKeys[chan->mNumScalingKeys - 1];
                if (lastScaleKey.mTime > maxDuration) {
                    maxDuration = lastScaleKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumScalingKeys);
            }
        }

        for (unsigned int j = 0; j < ai_anim->mNumMorphMeshChannels; ++j) {
            const auto* const chan = ai_anim->mMorphMeshChannels[j];

            if (0u != chan->mNumKeys) {
                const auto& lastKey = chan->mKeys[chan->mNumKeys - 1u];
                if (lastKey.mTime > maxDuration) {
                    maxDuration = lastKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumKeys);
            }
        }

        ai_anim->mDuration = maxDuration;
        ai_anim->mTicksPerSecond = 1000.0;

        mScene->mAnimations[i] = ai_anim;
    }
}